

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

void __thiscall
deqp::sl::ShaderParser::parseValueElement
          (ShaderParser *this,DataType expectedDataType,Value *result)

{
  int iVar1;
  float fVar2;
  int iVar3;
  char *pcVar4;
  float fVar5;
  int local_a8;
  int scalarNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_74;
  float local_70;
  int signMult_1;
  float signMult;
  int scalarNdx;
  Element elems [16];
  int scalarSize;
  DataType scalarType;
  Value *result_local;
  DataType expectedDataType_local;
  ShaderParser *this_local;
  
  elems[0xf].int32 = glu::getDataTypeScalarType(expectedDataType);
  elems[0xe].int32 = glu::getDataTypeScalarSize(expectedDataType);
  if (1 < elems[0xe].int32) {
    advanceToken(this);
    advanceToken(this,TOKEN_LEFT_PAREN);
  }
  for (signMult_1 = 0; signMult_1 < elems[0xe].int32; signMult_1 = signMult_1 + 1) {
    if (elems[0xf].int32 == 1) {
      local_70 = 1.0;
      if (this->m_curToken == TOKEN_MINUS) {
        local_70 = -1.0;
        advanceToken(this);
      }
      assumeToken(this,TOKEN_FLOAT_LITERAL);
      fVar2 = local_70;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      fVar5 = parseFloatLiteral(this,pcVar4);
      (&signMult)[signMult_1] = fVar2 * fVar5;
      advanceToken(this,TOKEN_FLOAT_LITERAL);
    }
    else if ((elems[0xf].int32 == 0x1b) || (elems[0xf].int32 == 0x1f)) {
      local_74 = 1;
      if (this->m_curToken == TOKEN_MINUS) {
        local_74 = -1;
        advanceToken(this);
      }
      assumeToken(this,TOKEN_INT_LITERAL);
      iVar1 = local_74;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iVar3 = parseIntLiteral(this,pcVar4);
      (&signMult)[signMult_1] = (float)(iVar1 * iVar3);
      advanceToken(this,TOKEN_INT_LITERAL);
    }
    else {
      (&signMult)[signMult_1] = (float)(uint)(this->m_curToken == TOKEN_TRUE);
      if ((this->m_curToken != TOKEN_TRUE) && (this->m_curToken != TOKEN_FALSE)) {
        std::operator+(&local_98,"unexpected token, expecting bool: ",&this->m_curTokenStr);
        parseError(this,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      advanceToken(this);
    }
    if (signMult_1 != elems[0xe].int32 + -1) {
      advanceToken(this,TOKEN_COMMA);
    }
  }
  if (1 < elems[0xe].int32) {
    advanceToken(this,TOKEN_RIGHT_PAREN);
  }
  for (local_a8 = 0; local_a8 < elems[0xe].int32; local_a8 = local_a8 + 1) {
    std::
    vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
    ::push_back(&result->elements,(value_type *)(&signMult + local_a8));
  }
  return;
}

Assistant:

void ShaderParser::parseValueElement(DataType expectedDataType, ShaderCase::Value& result)
{
	DataType scalarType = getDataTypeScalarType(expectedDataType);
	int		 scalarSize = getDataTypeScalarSize(expectedDataType);

	/* \todo [2010-04-19 petri] Support arrays. */
	ShaderCase::Value::Element elems[16];

	if (scalarSize > 1)
	{
		DE_ASSERT(mapDataTypeToken(m_curToken) == expectedDataType);
		advanceToken(); // data type (float, vec2, etc.)
		advanceToken(TOKEN_LEFT_PAREN);
	}

	for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
	{
		if (scalarType == TYPE_FLOAT)
		{
			float signMult = 1.0f;
			if (m_curToken == TOKEN_MINUS)
			{
				signMult = -1.0f;
				advanceToken();
			}

			assumeToken(TOKEN_FLOAT_LITERAL);
			elems[scalarNdx].float32 = signMult * parseFloatLiteral(m_curTokenStr.c_str());
			advanceToken(TOKEN_FLOAT_LITERAL);
		}
		else if (scalarType == TYPE_INT || scalarType == TYPE_UINT)
		{
			int signMult = 1;
			if (m_curToken == TOKEN_MINUS)
			{
				signMult = -1;
				advanceToken();
			}

			assumeToken(TOKEN_INT_LITERAL);
			elems[scalarNdx].int32 = signMult * parseIntLiteral(m_curTokenStr.c_str());
			advanceToken(TOKEN_INT_LITERAL);
		}
		else
		{
			DE_ASSERT(scalarType == TYPE_BOOL);
			elems[scalarNdx].bool32 = (m_curToken == TOKEN_TRUE);
			if (m_curToken != TOKEN_TRUE && m_curToken != TOKEN_FALSE)
				parseError(string("unexpected token, expecting bool: " + m_curTokenStr));
			advanceToken(); // true/false
		}

		if (scalarNdx != (scalarSize - 1))
			advanceToken(TOKEN_COMMA);
	}

	if (scalarSize > 1)
		advanceToken(TOKEN_RIGHT_PAREN);

	// Store results.
	for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
		result.elements.push_back(elems[scalarNdx]);
}